

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

void __thiscall czh::lexer::Lexer::skip(Lexer *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  allocator<char> local_e1;
  Pos local_e0;
  Pos bak;
  string local_a0;
  Token tmp;
  
  while( true ) {
    iVar2 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_File[7])();
    if ((char)iVar2 == '\0') break;
    sVar4 = get_character_size(this);
    if (sVar4 != 1) break;
    iVar2 = isspace((int)this->ch);
    if (iVar2 == 0) break;
    cVar1 = get_char(this);
    this->ch = cVar1;
  }
  do {
    iVar2 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_File[7])();
    if (((char)iVar2 == '\0') || (this->ch != '<')) {
      return;
    }
    token::Pos::Pos((Pos *)&tmp,&this->codepos);
    tmp.what.value.
    super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
    .
    super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
    .
    super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
    .
    super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
    .
    super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
    ._M_u._0_8_ = 1;
    token::Pos::Pos(&bak,(Pos *)&tmp);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&tmp.what.value.
                       super__Variant_base<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Move_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                       .
                       super__Copy_assign_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                       .
                       super__Move_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                       .
                       super__Copy_ctor_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                       .
                       super__Variant_storage_alias<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char>_>_>_>
                       ._M_u + 0x10));
    cVar1 = get_char(this);
    iVar2 = 0;
    while( true ) {
      this->ch = cVar1;
      iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_vptr_File[7])();
      if ((char)iVar3 == '\0') break;
      cVar1 = this->ch;
      if ((cVar1 == '>') && (iVar2 == 0)) goto LAB_0011817e;
      iVar2 = (iVar2 + (uint)(cVar1 == '<')) - (uint)(cVar1 == '>');
      cVar1 = get_char(this);
    }
    if (iVar2 != 0) {
      iVar2 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_vptr_File[7])();
      if ((char)iVar2 == '\0') {
        token::Pos::Pos(&local_e0,&bak);
        token::Token::Token<int>(&tmp,UNEXPECTED,0x3c,&local_e0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_e0.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Expected \'>\' to match this \'<\'.",&local_e1);
        token::Token::report_error(&tmp,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        token::Token::~Token(&tmp);
      }
    }
    if (this->ch == '>') {
LAB_0011817e:
      cVar1 = get_char(this);
      this->ch = cVar1;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  } while( true );
}

Assistant:

void skip()
    {
      while (check_char() && get_character_size() == 1 && isspace(ch))
      {
        ch = get_char();
      }
      while (check_char() && ch == '<')
      {
        int notes = 0;
        auto bak = get_pos().set_size(1);
        ch = get_char();
        while (check_char() && !(ch == '>' && notes == 0))
        {
          if (ch == '<') ++notes;
          if (ch == '>') --notes;
          ch = get_char();
        }
        if (notes != 0 && !check_char())
        {
          token::Token tmp(token::TokenType::UNEXPECTED, static_cast<int>('<'), bak);
          tmp.report_error("Expected '>' to match this '<'.");
        }
        if (ch == '>')
        {
          ch = get_char();
        }
      }
    }